

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O2

pointer __thiscall
gmlc::networking::TcpConnection::create
          (TcpConnection *this,SocketFactory *sf,io_context *io_context,string *connection,
          string *port,size_t bufferSize)

{
  element_type *peVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  TcpConnection *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  pointer pVar6;
  __shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2> local_b8;
  string *local_a0;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  string local_70 [32];
  string local_50 [32];
  
  local_a0 = port;
  this_00 = (TcpConnection *)operator_new(0x240);
  TcpConnection(this_00,sf,io_context,bufferSize);
  std::__shared_ptr<gmlc::networking::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<gmlc::networking::TcpConnection,void>
            ((__shared_ptr<gmlc::networking::TcpConnection,(__gnu_cxx::_Lock_policy)2> *)this,
             this_00);
  peVar1 = (((this->super_enable_shared_from_this<gmlc::networking::TcpConnection>)._M_weak_this.
             super___weak_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           socket_).super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string
            (local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      connection);
  std::__cxx11::string::string
            (local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0)
  ;
  std::__shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_b8,
             (__shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_98._M_unused._M_object = operator_new(0x10);
  uVar2 = local_b8._M_ptr._0_4_;
  uVar3 = local_b8._M_ptr._4_4_;
  uVar4 = local_b8._M_refcount._M_pi._0_4_;
  uVar5 = local_b8._M_refcount._M_pi._4_4_;
  local_b8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_b8._M_ptr = (element_type *)0x0;
  *(undefined4 *)local_98._M_unused._0_8_ = uVar2;
  *(undefined4 *)((long)local_98._M_unused._0_8_ + 4) = uVar3;
  *(undefined4 *)((long)local_98._M_unused._0_8_ + 8) = uVar4;
  *(undefined4 *)((long)local_98._M_unused._0_8_ + 0xc) = uVar5;
  pcStack_80 = std::
               _Function_handler<void_(const_std::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/ThirdParty/networking/gmlc/networking/TcpConnection.cpp:257:27)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(const_std::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/ThirdParty/networking/gmlc/networking/TcpConnection.cpp:257:27)>
             ::_M_manager;
  (**(code **)((long)peVar1->_vptr_Socket + 0x28))(peVar1,local_50,local_70);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_98);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8._M_refcount);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  pVar6.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  pVar6.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this;
  return (pointer)pVar6.
                  super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TcpConnection::pointer TcpConnection::create(
    const SocketFactory& sf,
    asio::io_context& io_context,
    const std::string& connection,
    const std::string& port,
    size_t bufferSize)
{
    auto ptr = pointer(new TcpConnection(sf, io_context, bufferSize));

    ptr->socket_->async_connect(
        connection, port, [ptr](const std::error_code& error) {
            ptr->connect_handler(error);
        });
    return ptr;
}